

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O2

bool __thiscall QMimeGlobPattern::matchFileName(QMimeGlobPattern *this,QString *inputFileName)

{
  char16_t cVar1;
  storage_type_conflict *psVar2;
  storage_type_conflict *psVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  qsizetype qVar6;
  bool bVar7;
  char16_t *pcVar8;
  storage_type_conflict *psVar9;
  char16_t *pcVar10;
  long lVar11;
  long in_FS_OFFSET;
  QStringView pattern;
  QLatin1StringView local_78;
  QStringView local_68;
  QRegularExpression rx;
  storage_type_conflict *local_50;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  if (this->m_caseSensitivity == CaseInsensitive) {
    QString::toLower_helper((QString *)&local_48,inputFileName);
  }
  else {
    local_48.d = (inputFileName->d).d;
    local_48.ptr = (inputFileName->d).ptr;
    local_48.size = (inputFileName->d).size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  qVar6 = local_48.size;
  pcVar8 = local_48.ptr;
  psVar2 = (storage_type_conflict *)(this->m_pattern).d.size;
  if (psVar2 == (storage_type_conflict *)0x0) goto switchD_00444bcd_default;
  switch(this->m_patternType) {
  case SuffixPattern:
    if (psVar2 <= (storage_type_conflict *)(local_48.size + 1)) {
      pcVar8 = (this->m_pattern).d.ptr;
      if (pcVar8 == (char16_t *)0x0) {
        pcVar8 = L"";
      }
      pcVar10 = local_48.ptr;
      if (local_48.ptr == (char16_t *)0x0) {
        pcVar10 = L"";
      }
      psVar9 = (storage_type_conflict *)0x0;
      lVar11 = -1;
      do {
        psVar3 = psVar2;
        if ((undefined1 *)((long)psVar2 + lVar11) == (undefined1 *)0x0) break;
        puVar4 = (undefined1 *)((long)psVar2 + lVar11);
        psVar9 = (storage_type_conflict *)((long)psVar9 + 1);
        puVar5 = (undefined1 *)(local_48.size + lVar11);
        lVar11 = lVar11 + -1;
        psVar3 = psVar9;
      } while (pcVar8[(long)puVar4] == pcVar10[(long)puVar5]);
LAB_00444d98:
      bVar7 = psVar2 == psVar3;
      goto LAB_00444dea;
    }
    break;
  case PrefixPattern:
    if (psVar2 <= (storage_type_conflict *)(local_48.size + 1)) {
      pcVar8 = (this->m_pattern).d.ptr;
      if (pcVar8 == (char16_t *)0x0) {
        pcVar8 = L"";
      }
      pcVar10 = local_48.ptr;
      if (local_48.ptr == (char16_t *)0x0) {
        pcVar10 = L"";
      }
      for (psVar9 = (storage_type_conflict *)0x1;
          (psVar3 = psVar2, psVar2 != psVar9 &&
          (psVar3 = psVar9, pcVar8[(long)((long)psVar9 + -1)] == pcVar10[(long)((long)psVar9 + -1)])
          ); psVar9 = (storage_type_conflict *)((long)psVar9 + 1)) {
      }
      goto LAB_00444d98;
    }
    break;
  case LiteralPattern:
    bVar7 = ::comparesEqual(&this->m_pattern,(QString *)&local_48);
    goto LAB_00444dea;
  case VdrPattern:
    if (((((undefined1 *)local_48.size == (undefined1 *)0x7) &&
         (bVar7 = QChar::isDigit((uint)(ushort)*local_48.ptr), bVar7)) &&
        (bVar7 = QChar::isDigit((uint)(ushort)pcVar8[1]), bVar7)) &&
       (bVar7 = QChar::isDigit((uint)(ushort)pcVar8[2]), bVar7)) {
      local_68.m_size = 7;
      local_68.m_data = pcVar8;
      _rx = QStringView::mid(&local_68,3,4);
      local_78.m_size = 4;
      local_78.m_data = ".vdr";
LAB_00444ddb:
      bVar7 = ::comparesEqual(&local_78,(QStringView *)&rx);
      goto LAB_00444dea;
    }
    break;
  case AnimPattern:
    if ((undefined1 *)0x5 < (ulong)local_48.size) {
      cVar1 = local_48.ptr[(long)(local_48.size + -1)];
      bVar7 = QChar::isDigit((uint)(ushort)cVar1);
      if (bVar7) {
        if (cVar1 != L'0') {
LAB_00444da3:
          local_68.m_size = qVar6;
          local_68.m_data = pcVar8;
          _rx = QStringView::mid(&local_68,(qsizetype)(qVar6 + -6),5);
          local_78.m_size = 5;
          local_78.m_data = ".anim";
          goto LAB_00444ddb;
        }
      }
      else if (cVar1 == L'j') goto LAB_00444da3;
    }
    break;
  case OtherPattern:
    rx.d.d.ptr = (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)
                 (QExplicitlySharedDataPointer<QRegularExpressionPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    pattern.m_data = psVar2;
    pattern.m_size = (qsizetype)&rx;
    QRegularExpression::fromWildcard
              (pattern,(CaseSensitivity)(this->m_pattern).d.ptr,(WildcardConversionOptions)0x0);
    QRegularExpression::match
              ((QRegularExpression *)&local_68,(QString *)&rx,(qsizetype)&local_48,NormalMatch,
               (MatchOptions)0x0);
    bVar7 = QRegularExpressionMatch::hasMatch((QRegularExpressionMatch *)&local_68);
    QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_68);
    QRegularExpression::~QRegularExpression(&rx);
    goto LAB_00444dea;
  }
switchD_00444bcd_default:
  bVar7 = false;
LAB_00444dea:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar7;
}

Assistant:

bool QMimeGlobPattern::matchFileName(const QString &inputFileName) const
{
    // "Applications MUST match globs case-insensitively, except when the case-sensitive
    // attribute is set to true."
    // The constructor takes care of putting case-insensitive patterns in lowercase.
    const QString fileName = m_caseSensitivity == Qt::CaseInsensitive
            ? inputFileName.toLower() : inputFileName;

    const qsizetype patternLength = m_pattern.size();
    if (!patternLength)
        return false;
    const qsizetype fileNameLength = fileName.size();

    switch (m_patternType) {
    case SuffixPattern: {
        if (fileNameLength + 1 < patternLength)
            return false;

        const QChar *c1 = m_pattern.unicode() + patternLength - 1;
        const QChar *c2 = fileName.unicode() + fileNameLength - 1;
        int cnt = 1;
        while (cnt < patternLength && *c1-- == *c2--)
            ++cnt;
        return cnt == patternLength;
    }
    case PrefixPattern: {
        if (fileNameLength + 1 < patternLength)
            return false;

        const QChar *c1 = m_pattern.unicode();
        const QChar *c2 = fileName.unicode();
        int cnt = 1;
        while (cnt < patternLength && *c1++ == *c2++)
           ++cnt;
        return cnt == patternLength;
    }
    case LiteralPattern:
        return (m_pattern == fileName);
    case VdrPattern: // "[0-9][0-9][0-9].vdr" case
        return fileNameLength == 7
                && fileName.at(0).isDigit() && fileName.at(1).isDigit() && fileName.at(2).isDigit()
                && QStringView{fileName}.mid(3, 4) == ".vdr"_L1;
    case AnimPattern: { // "*.anim[1-9j]" case
        if (fileNameLength < 6)
            return false;
        const QChar lastChar = fileName.at(fileNameLength - 1);
        const bool lastCharOK = (lastChar.isDigit() && lastChar != u'0')
                              || lastChar == u'j';
        return lastCharOK && QStringView{fileName}.mid(fileNameLength - 6, 5) == ".anim"_L1;
    }
    case OtherPattern:
        // Other fallback patterns: slow but correct method
#if QT_CONFIG(regularexpression)
        auto rx = QRegularExpression::fromWildcard(m_pattern);
        return rx.match(fileName).hasMatch();
#else
        return false;
#endif
    }
    return false;
}